

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::ForkHub<kj::Own<CallResultHolder>_>_>::dispose
          (Own<kj::_::ForkHub<kj::Own<CallResultHolder>_>_> *this)

{
  ForkHub<kj::Own<CallResultHolder>_> *object;
  ForkHub<kj::Own<CallResultHolder>_> *ptrCopy;
  Own<kj::_::ForkHub<kj::Own<CallResultHolder>_>_> *this_local;
  
  object = this->ptr;
  if (object != (ForkHub<kj::Own<CallResultHolder>_> *)0x0) {
    this->ptr = (ForkHub<kj::Own<CallResultHolder>_> *)0x0;
    Disposer::
    dispose<kj::_::ForkHub<kj::Own<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }